

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

ITrackerPtr __thiscall
Catch::TestCaseTracking::ITracker::findChild(ITracker *this,NameAndLocation *nameAndLocation)

{
  bool bVar1;
  reference psVar2;
  shared_ptr<Catch::TestCaseTracking::ITracker> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  ITrackerPtr IVar4;
  __normal_iterator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_*,_std::vector<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>_>
  local_48;
  shared_ptr<Catch::TestCaseTracking::ITracker> *local_40;
  shared_ptr<Catch::TestCaseTracking::ITracker> *local_38;
  __normal_iterator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_*,_std::vector<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>_>
  local_30;
  __normal_iterator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_*,_std::vector<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>_>
  local_28;
  __normal_iterator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_*,_std::vector<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>_>
  it;
  NameAndLocation *nameAndLocation_local;
  ITracker *this_local;
  
  it._M_current = in_RDX;
  local_30._M_current =
       (shared_ptr<Catch::TestCaseTracking::ITracker> *)
       std::
       vector<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>
       ::begin((vector<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>
                *)&nameAndLocation[1].name._M_string_length);
  local_38 = (shared_ptr<Catch::TestCaseTracking::ITracker> *)
             std::
             vector<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>
             ::end((vector<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>
                    *)&nameAndLocation[1].name._M_string_length);
  local_40 = it._M_current;
  local_28 = std::
             find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<Catch::TestCaseTracking::ITracker>*,std::vector<std::shared_ptr<Catch::TestCaseTracking::ITracker>,std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>>>>,Catch::TestCaseTracking::ITracker::findChild(Catch::TestCaseTracking::NameAndLocation_const&)::__0>
                       (local_30,(__normal_iterator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_*,_std::vector<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>_>
                                  )local_38,(anon_class_8_1_9c565101_for__M_pred)it._M_current);
  local_48._M_current =
       (shared_ptr<Catch::TestCaseTracking::ITracker> *)
       std::
       vector<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>
       ::end((vector<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>
              *)&nameAndLocation[1].name._M_string_length);
  bVar1 = __gnu_cxx::operator!=(&local_28,&local_48);
  if (bVar1) {
    psVar2 = __gnu_cxx::
             __normal_iterator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_*,_std::vector<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>_>
             ::operator*(&local_28);
    std::shared_ptr<Catch::TestCaseTracking::ITracker>::shared_ptr
              ((shared_ptr<Catch::TestCaseTracking::ITracker> *)this,psVar2);
    _Var3._M_pi = extraout_RDX;
  }
  else {
    std::shared_ptr<Catch::TestCaseTracking::ITracker>::shared_ptr
              ((shared_ptr<Catch::TestCaseTracking::ITracker> *)this,(nullptr_t)0x0);
    _Var3._M_pi = extraout_RDX_00;
  }
  IVar4.super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var3._M_pi;
  IVar4.super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       this;
  return (ITrackerPtr)
         IVar4.super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ITrackerPtr ITracker::findChild(NameAndLocation const &nameAndLocation) {
            auto it = std::find_if(
                m_children.begin(),
                m_children.end(),
                [&nameAndLocation](ITrackerPtr const &tracker) {
                    return tracker->nameAndLocation().location ==
                        nameAndLocation.location &&
                        tracker->nameAndLocation().name == nameAndLocation.name;
                });
            return (it != m_children.end()) ? *it : nullptr;
        }